

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::EntryShift(RecyclableObject *function,CallInfo callInfo,...)

{
  uint32 index;
  Type *pTVar1;
  Type TVar2;
  ScriptContext *scriptContext;
  SparseArraySegmentBase *pSVar3;
  Recycler *recycler;
  JavascriptLibrary *pJVar4;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  DynamicObjectFlags DVar8;
  int iVar9;
  BOOL BVar10;
  uint32 uVar11;
  uint uVar12;
  undefined4 *puVar13;
  Var pvVar14;
  JavascriptArray *pJVar15;
  uint64 uVar16;
  uint64 uVar17;
  uint32 index_00;
  Var pvVar18;
  double dVar19;
  undefined1 *value;
  undefined1 auVar20 [16];
  int in_stack_00000010;
  BigIndex local_b0;
  CallInfo local_a0;
  CallInfo callInfo_local;
  ArgumentReader args;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  BigIndex length;
  Var res;
  RecyclableObject *dynamicObject;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_a0 = callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1765,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar6) goto LAB_00b79389;
    *puVar13 = 0;
  }
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_a0);
  dynamicObject =
       (RecyclableObject *)
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_78 = (undefined1  [8])((ScriptContext *)dynamicObject)->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
  ((ThreadContext *)local_78)->noJsReentrancy = true;
  pvVar14 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,pvVar14);
  if (((ulong)local_a0 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x176a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar6) goto LAB_00b79389;
    *puVar13 = 0;
  }
  length.bigIndex = (uint64)(dynamicObject->type).ptr[0x1a].propertyCache.ptr;
  if (((ulong)callInfo_local & 0xffffff) == 0) goto LAB_00b791b0;
  pvVar14 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  bVar6 = IsNonES5Array(pvVar14);
  if (bVar6) {
    pvVar14 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    pJVar15 = VarTo<Js::JavascriptArray>(pvVar14);
    iVar9 = (*(pJVar15->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x66])(pJVar15);
    if (iVar9 == 0) {
      pvVar14 = Arguments::operator[]((Arguments *)&callInfo_local,0);
      pJVar15 = UnsafeVarTo<Js::JavascriptArray>(pvVar14);
      bVar6 = HasAnyES5ArrayInPrototypeChain(pJVar15,false);
      if (!bVar6) {
        pvVar14 = Arguments::operator[]((Arguments *)&callInfo_local,0);
        pJVar15 = UnsafeVarTo<Js::JavascriptArray>(pvVar14);
        TVar2 = (pJVar15->super_ArrayObject).length;
        if (TVar2 == 0) goto LAB_00b791b0;
        bVar6 = IsFillFromPrototypes(pJVar15);
        if (bVar6) {
          FillFromPrototypes(pJVar15,0,(pJVar15->super_ArrayObject).length);
        }
        if (TVar2 != (pJVar15->super_ArrayObject).length) {
          Throw::FatalInternalError(-0x7fffbffb);
        }
        DVar8 = DynamicObject::GetArrayFlags((DynamicObject *)pJVar15);
        if ((((DVar8 & HasNoMissingValues) != None) &&
            (pSVar3 = (pJVar15->head).ptr, pSVar3 != (SparseArraySegmentBase *)0x0)) &&
           ((pSVar3->next).ptr != (SparseArraySegmentBase *)0x0)) {
          DVar8 = DynamicObject::GetArrayFlags((DynamicObject *)pJVar15);
          DynamicObject::SetArrayFlags((DynamicObject *)pJVar15,DVar8 & ~HasNoMissingValues);
        }
        pTVar1 = &(pJVar15->super_ArrayObject).length;
        *pTVar1 = *pTVar1 - 1;
        ClearSegmentMap(pJVar15);
        recycler = (Recycler *)
                   dynamicObject[0x120].super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject;
        bVar6 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pJVar15);
        if (bVar6) {
          bVar7 = false;
        }
        else {
          bVar7 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pJVar15);
        }
        jsReentLock._24_8_ = dynamicObject[0x3b].type.ptr;
        length.index._0_2_ = 0;
        length.index._2_1_ = 1;
        pJVar4 = (((Type *)(jsReentLock._24_8_ + 0x16f8))->javascriptLibrary).ptr;
        if (pJVar4 != (JavascriptLibrary *)0x0) {
          length.index._0_2_ =
               (ushort)*(byte *)&(pJVar4->super_JavascriptLibraryBase).setConstructor.ptr << 8;
          *(undefined1 *)&(pJVar4->super_JavascriptLibraryBase).setConstructor.ptr = 1;
        }
        pSVar3 = (pJVar15->head).ptr;
        if (pSVar3->length == 0) {
          if (bVar6) goto LAB_00b792bf;
          if (bVar7 != false) goto LAB_00b792e8;
LAB_00b79317:
          ShiftHelper<void*>(pJVar15,(ScriptContext *)dynamicObject);
        }
        else if (bVar6) {
          uVar12 = SparseArraySegment<int>::GetElement((SparseArraySegment<int> *)pSVar3,0);
          if (uVar12 == 0xfff80002) {
            length.bigIndex = (uint64)(dynamicObject->type).ptr[0x1a].propertyCache.ptr;
          }
          else {
            length.bigIndex = (ulong)uVar12 | 0x1000000000000;
          }
          SparseArraySegment<int>::RemoveElement
                    ((SparseArraySegment<int> *)(pJVar15->head).ptr,recycler,0);
LAB_00b792bf:
          ShiftHelper<int>(pJVar15,(ScriptContext *)dynamicObject);
        }
        else {
          if (bVar7 == false) {
            length.bigIndex =
                 (uint64)SparseArraySegment<void_*>::GetElement
                                   ((SparseArraySegment<void_*> *)pSVar3,0);
            if ((undefined1 *)length.bigIndex == &DAT_40002fff80002) {
              length.bigIndex = (uint64)(dynamicObject->type).ptr[0x1a].propertyCache.ptr;
            }
            else {
              length.bigIndex =
                   (uint64)CrossSite::MarshalVar
                                     ((ScriptContext *)dynamicObject,(Var)length.bigIndex,false);
            }
            SparseArraySegment<void_*>::RemoveElement
                      ((SparseArraySegment<void_*> *)(pJVar15->head).ptr,recycler,0);
            goto LAB_00b79317;
          }
          value = (undefined1 *)
                  SparseArraySegment<double>::GetElement((SparseArraySegment<double> *)pSVar3,0);
          if (value == &DAT_fff80002fff80002) {
            length.bigIndex = (uint64)(dynamicObject->type).ptr[0x1a].propertyCache.ptr;
          }
          else {
            length.bigIndex =
                 (uint64)JavascriptNumber::ToVarNoCheck
                                   ((double)value,(ScriptContext *)dynamicObject);
          }
          SparseArraySegment<double>::RemoveElement
                    ((SparseArraySegment<double> *)(pJVar15->head).ptr,recycler,0);
LAB_00b792e8:
          ShiftHelper<double>(pJVar15,(ScriptContext *)dynamicObject);
        }
        length.index._0_1_ = 1;
        AutoDisableInterrupt::~AutoDisableInterrupt
                  ((AutoDisableInterrupt *)&jsReentLock.m_savedNoJsReentrancy);
        goto LAB_00b791b0;
      }
    }
  }
  res = (Var)0x0;
  pvVar14 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  BVar10 = JavascriptConversion::ToObject
                     (pvVar14,(ScriptContext *)dynamicObject,(RecyclableObject **)&res);
  if (BVar10 == 0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)dynamicObject,-0x7ff5ec42,L"Array.prototype.shift");
  }
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  uVar16 = OP_GetLength(res,(ScriptContext *)dynamicObject);
  BigIndex::BigIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy,uVar16);
  JsReentLock::MutateArrayObject((JsReentLock *)local_78);
  *(bool *)((long)local_78 + 0x108) = true;
  BigIndex::BigIndex(&local_b0,0);
  bVar6 = BigIndex::operator==((BigIndex *)&jsReentLock.m_savedNoJsReentrancy,&local_b0);
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  if (bVar6) {
    BVar10 = JavascriptOperators::SetProperty
                       (res,(RecyclableObject *)res,0xd1,&DAT_1000000000000,
                        (ScriptContext *)dynamicObject,PropertyOperation_ThrowIfNotExtensible);
    if (BVar10 == 0) {
      JavascriptError::ThrowTypeError
                ((ScriptContext *)dynamicObject,-0x7ff5fe43,L"Array.prototype.shift");
    }
    JsReentLock::MutateArrayObject((JsReentLock *)local_78);
    *(bool *)((long)local_78 + 0x108) = true;
    length.bigIndex = (uint64)(dynamicObject->type).ptr[0x1a].propertyCache.ptr;
    goto LAB_00b791b0;
  }
  BVar10 = JavascriptOperators::GetItem
                     ((RecyclableObject *)res,0,(Var *)&length.bigIndex,
                      (ScriptContext *)dynamicObject);
  JsReentLock::MutateArrayObject((JsReentLock *)local_78);
  *(bool *)((long)local_78 + 0x108) = true;
  if (BVar10 == 0) {
    length.bigIndex = (uint64)(dynamicObject->type).ptr[0x1a].propertyCache.ptr;
  }
  BigIndex::operator--((BigIndex *)&jsReentLock.m_savedNoJsReentrancy);
  if (jsReentLock._24_4_ == -1) {
    uVar11 = 0xffffffff;
LAB_00b78cee:
    index_00 = 0;
    do {
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      index = index_00 + 1;
      BVar10 = JavascriptOperators::HasItem((RecyclableObject *)res,index);
      JsReentLock::MutateArrayObject((JsReentLock *)local_78);
      *(bool *)((long)local_78 + 0x108) = true;
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      if (BVar10 == 0) {
        BVar10 = JavascriptOperators::DeleteItem
                           ((RecyclableObject *)res,index_00,
                            PropertyOperation_ThrowOnDeleteIfNotConfig);
        if (BVar10 == 0) {
          JavascriptError::ThrowTypeError
                    ((ScriptContext *)dynamicObject,-0x7ff5fe43,L"Array.prototype.shift");
        }
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
      }
      else {
        pvVar14 = JavascriptOperators::GetItem
                            ((RecyclableObject *)res,index,(ScriptContext *)dynamicObject);
        BVar10 = JavascriptOperators::SetItem
                           (res,(RecyclableObject *)res,index_00,pvVar14,
                            (ScriptContext *)dynamicObject,PropertyOperation_ThrowIfNotExtensible,1)
        ;
        if (BVar10 == 0) {
          JavascriptError::ThrowTypeError
                    ((ScriptContext *)dynamicObject,-0x7ff5fe43,L"Array.prototype.shift");
        }
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
      }
      *(bool *)((long)local_78 + 0x108) = true;
      index_00 = index;
    } while (uVar11 != index);
  }
  else {
    uVar11 = BigIndex::GetSmallIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy);
    if (uVar11 != 0) goto LAB_00b78cee;
  }
  uVar16 = 0xffffffff;
  while( true ) {
    BigIndex::BigIndex(&local_b0,uVar16);
    bVar6 = BigIndex::operator>((BigIndex *)&jsReentLock.m_savedNoJsReentrancy,&local_b0);
    pvVar14 = res;
    if (!bVar6) break;
    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    uVar17 = uVar16 + 1;
    BVar10 = JavascriptOperators::HasItem((RecyclableObject *)res,uVar17);
    JsReentLock::MutateArrayObject((JsReentLock *)local_78);
    *(bool *)((long)local_78 + 0x108) = true;
    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    if (BVar10 == 0) {
      BVar10 = JavascriptOperators::DeleteItem
                         ((RecyclableObject *)res,uVar16,PropertyOperation_ThrowOnDeleteIfNotConfig)
      ;
      if (BVar10 == 0) {
        JavascriptError::ThrowTypeError
                  ((ScriptContext *)dynamicObject,-0x7ff5fe43,L"Array.prototype.shift");
      }
      JsReentLock::MutateArrayObject((JsReentLock *)local_78);
    }
    else {
      pvVar14 = JavascriptOperators::GetItem
                          ((RecyclableObject *)res,uVar17,(ScriptContext *)dynamicObject);
      BVar10 = JavascriptOperators::SetItem
                         (res,(RecyclableObject *)res,uVar16,pvVar14,(ScriptContext *)dynamicObject,
                          PropertyOperation_ThrowIfNotExtensible);
      if (BVar10 == 0) {
        JavascriptError::ThrowTypeError
                  ((ScriptContext *)dynamicObject,-0x7ff5fe43,L"Array.prototype.shift");
      }
      JsReentLock::MutateArrayObject((JsReentLock *)local_78);
    }
    *(bool *)((long)local_78 + 0x108) = true;
    uVar16 = uVar17;
  }
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  if (jsReentLock._24_4_ == -1) {
    uVar16 = BigIndex::GetBigIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy);
    BVar10 = JavascriptOperators::DeleteItem
                       ((RecyclableObject *)pvVar14,uVar16,
                        PropertyOperation_ThrowOnDeleteIfNotConfig);
    pvVar14 = res;
    if (BVar10 == 0) goto LAB_00b793a0;
    uVar16 = BigIndex::GetBigIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy);
    if (uVar16 < 0x80000000) {
      pvVar18 = (Var)(uVar16 | 0x1000000000000);
    }
    else {
      auVar20._8_4_ = (int)(uVar16 >> 0x20);
      auVar20._0_8_ = uVar16;
      auVar20._12_4_ = 0x45300000;
      dVar19 = ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0) +
               (auVar20._8_8_ - 1.9342813113834067e+25);
      uVar16 = NumberUtilities::ToSpecial(dVar19);
      bVar6 = NumberUtilities::IsNan(dVar19);
      if (((bVar6) && (uVar17 = NumberUtilities::ToSpecial(dVar19), uVar17 != 0xfff8000000000000))
         && (uVar17 = NumberUtilities::ToSpecial(dVar19), uVar17 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar6) goto LAB_00b79389;
        *puVar13 = 0;
      }
      pvVar18 = (Var)(uVar16 ^ 0xfffc000000000000);
    }
    iVar9 = JavascriptOperators::SetProperty
                      (pvVar14,(RecyclableObject *)pvVar14,0xd1,pvVar18,
                       (ScriptContext *)dynamicObject,PropertyOperation_ThrowIfNotExtensible);
  }
  else {
    uVar11 = BigIndex::GetSmallIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy);
    BVar10 = JavascriptOperators::DeleteItem
                       ((RecyclableObject *)pvVar14,uVar11,
                        PropertyOperation_ThrowOnDeleteIfNotConfig);
    pvVar14 = res;
    if (BVar10 == 0) goto LAB_00b793a0;
    uVar11 = BigIndex::GetSmallIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy);
    if ((int)uVar11 < 0) {
      dVar19 = (double)uVar11;
      uVar16 = NumberUtilities::ToSpecial(dVar19);
      bVar6 = NumberUtilities::IsNan(dVar19);
      if (((bVar6) && (uVar17 = NumberUtilities::ToSpecial(dVar19), uVar17 != 0xfff8000000000000))
         && (uVar17 = NumberUtilities::ToSpecial(dVar19), uVar17 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar6) {
LAB_00b79389:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar13 = 0;
      }
      pvVar18 = (Var)(uVar16 ^ 0xfffc000000000000);
    }
    else {
      pvVar18 = (Var)((ulong)uVar11 | 0x1000000000000);
    }
    iVar9 = JavascriptOperators::SetProperty
                      (pvVar14,(RecyclableObject *)pvVar14,0xd1,pvVar18,
                       (ScriptContext *)dynamicObject,PropertyOperation_ThrowIfNotExtensible);
  }
  if (iVar9 != 0) {
    JsReentLock::MutateArrayObject((JsReentLock *)local_78);
    *(bool *)((long)local_78 + 0x108) = true;
LAB_00b791b0:
    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    return (Var)length.bigIndex;
  }
LAB_00b793a0:
  JavascriptError::ThrowTypeError
            ((ScriptContext *)dynamicObject,-0x7ff5fe43,L"Array.prototype.shift");
}

Assistant:

Var JavascriptArray::EntryShift(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Shift);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, args[0]);

        Assert(!(callInfo.Flags & CallFlags_New));

        Var res = scriptContext->GetLibrary()->GetUndefined();

        if (args.Info.Count == 0)
        {
            return res;
        }

        bool useNoSideEffectShift = JavascriptArray::IsNonES5Array(args[0])
            && !VarTo<JavascriptArray>(args[0])->IsCrossSiteObject()
            && !HasAnyES5ArrayInPrototypeChain(UnsafeVarTo<JavascriptArray>(args[0]));

        if (useNoSideEffectShift)
        {
            JavascriptArray * pArr = UnsafeVarTo<JavascriptArray>(args[0]);

            if (pArr->length == 0)
            {
                return res;
            }

            uint32 length = pArr->length;

            if(pArr->IsFillFromPrototypes())
            {
                pArr->FillFromPrototypes(0, pArr->length); // We need find all missing value from [[proto]] object
            }

            // As we have already established that the FillFromPrototype should not change the bound of the array.
            if (length != pArr->length)
            {
                Js::Throw::FatalInternalError();
            }

            if(pArr->HasNoMissingValues() && pArr->head && pArr->head->next)
            {
                // This function currently does not track missing values in the head segment if there are multiple segments
                pArr->SetHasNoMissingValues(false);
            }

            pArr->length--;

            pArr->ClearSegmentMap(); // Dump segmentMap on shift (before any allocation)

            Recycler * recycler = scriptContext->GetRecycler();

            bool isIntArray = false;
            bool isFloatArray = false;

            if(VarIs<JavascriptNativeIntArray>(pArr))
            {
                isIntArray = true;
            }
            else if(VarIs<JavascriptNativeFloatArray>(pArr))
            {
                isFloatArray = true;
            }

            // Code below has potential to throw due to OOM or SO. Just FailFast on those cases
            AutoDisableInterrupt failFastOnError(scriptContext->GetThreadContext());

            if (pArr->head->length != 0)
            {
                if(isIntArray)
                {
                    int32 nativeResult = SparseArraySegment<int32>::From(pArr->head)->GetElement(0);

                    if(SparseArraySegment<int32>::IsMissingItem(&nativeResult))
                    {
                        res = scriptContext->GetLibrary()->GetUndefined();
                    }
                    else
                    {
                        res = Js::JavascriptNumber::ToVar(nativeResult, scriptContext);
                    }
                    SparseArraySegment<int32>::From(pArr->head)->RemoveElement(recycler, 0);
                }
                else if (isFloatArray)
                {
                    double nativeResult = SparseArraySegment<double>::From(pArr->head)->GetElement(0);

                    if(SparseArraySegment<double>::IsMissingItem(&nativeResult))
                    {
                        res = scriptContext->GetLibrary()->GetUndefined();
                    }
                    else
                    {
                        res = Js::JavascriptNumber::ToVarNoCheck(nativeResult, scriptContext);
                    }
                    SparseArraySegment<double>::From(pArr->head)->RemoveElement(recycler, 0);
                }
                else
                {
                    res = SparseArraySegment<Var>::From(pArr->head)->GetElement(0);

                    if(SparseArraySegment<Var>::IsMissingItem(&res))
                    {
                        res = scriptContext->GetLibrary()->GetUndefined();
                    }
                    else
                    {
                        res = CrossSite::MarshalVar(scriptContext, res);
                    }
                    SparseArraySegment<Var>::From(pArr->head)->RemoveElement(recycler, 0);
                }
            }

            if(isIntArray)
            {
                ShiftHelper<int32>(pArr, scriptContext);
            }
            else if (isFloatArray)
            {
                ShiftHelper<double>(pArr, scriptContext);
            }
            else
            {
                ShiftHelper<Var>(pArr, scriptContext);
            }
            failFastOnError.Completed();

        }
        else
        {
            RecyclableObject* dynamicObject = nullptr;
            if (FALSE == JavascriptConversion::ToObject(args[0], scriptContext, &dynamicObject))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.shift"));
            }

            ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.shift"));

            JS_REENTRANT(jsReentLock, BigIndex length = OP_GetLength(dynamicObject, scriptContext));

            if (length == 0u)
            {
                // If length is 0, return 'undefined'
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(dynamicObject, dynamicObject, PropertyIds::length, TaggedInt::ToVarUnchecked(0), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                return scriptContext->GetLibrary()->GetUndefined();
            }

            JS_REENTRANT(jsReentLock,
                BOOL gotItem = JavascriptOperators::GetItem(dynamicObject, 0u, &res, scriptContext));
            if (!gotItem)
            {
                res = scriptContext->GetLibrary()->GetUndefined();
            }
            --length;
            uint32 lengthToUin32Max = length.IsSmallIndex() ? length.GetSmallIndex() : MaxArrayLength;
            for (uint32 i = 0u; i < lengthToUin32Max; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(dynamicObject, i + 1));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock,
                        element = JavascriptOperators::GetItem(dynamicObject, i + 1, scriptContext),
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(dynamicObject, dynamicObject, i, element, scriptContext, PropertyOperation_ThrowIfNotExtensible, /*skipPrototypeCheck*/ true)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(dynamicObject, i, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }
            }

            for (uint64 i = MaxArrayLength; length > i; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(dynamicObject, i + 1));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock,
                        element = JavascriptOperators::GetItem(dynamicObject, i + 1, scriptContext),
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(dynamicObject, dynamicObject, i, element, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(dynamicObject, i, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }
            }

            if (length.IsSmallIndex())
            {
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(dynamicObject, length.GetSmallIndex(), PropertyOperation_ThrowOnDeleteIfNotConfig)),
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(dynamicObject, dynamicObject, PropertyIds::length, JavascriptNumber::ToVar(length.GetSmallIndex(), scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
            }
            else
            {
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(dynamicObject, length.GetBigIndex(), PropertyOperation_ThrowOnDeleteIfNotConfig)),
                    h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(dynamicObject, dynamicObject, PropertyIds::length, JavascriptNumber::ToVar(length.GetBigIndex(), scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
            }
        }
        return res;
        JIT_HELPER_END(Array_Shift);
    }